

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::checkAttDerivationOK
          (TraverseSchema *this,DOMElement *elem,XercesAttGroupInfo *baseAttGrpInfo,
          XercesAttGroupInfo *childAttGrpInfo)

{
  XMLCh XVar1;
  XMLCh XVar2;
  DefAttTypes DVar3;
  DefAttTypes DVar4;
  QName *pQVar5;
  XMLCh *baseName;
  char cVar6;
  bool bVar7;
  SchemaAttDef *pSVar8;
  SchemaAttDef *pSVar9;
  XMLCh *pXVar10;
  XMLCh *pXVar11;
  XMLSize_t XVar12;
  XMLSize_t XVar13;
  TraverseSchema *this_00;
  XMLSize_t XVar14;
  int iVar15;
  SchemaAttDef *local_60;
  XMLSize_t local_50;
  
  if (baseAttGrpInfo->fAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    XVar13 = 0;
  }
  else {
    XVar13 = (baseAttGrpInfo->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
             fCurCount;
  }
  if (baseAttGrpInfo->fAnyAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    XVar12 = 0;
  }
  else {
    XVar12 = (baseAttGrpInfo->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
             fCurCount;
  }
  if (childAttGrpInfo->fAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = (childAttGrpInfo->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
               fCurCount;
  }
  if (childAttGrpInfo->fAnyAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    XVar14 = 0;
  }
  else {
    XVar14 = (childAttGrpInfo->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
             fCurCount;
  }
  this_00 = this;
  if ((XVar13 == 0 && XVar12 == 0) && (XVar14 != 0 || local_50 != 0)) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x6d);
  }
  if ((XVar12 == 0) ||
     (this_00 = (TraverseSchema *)baseAttGrpInfo->fAnyAttributes, this_00 == (TraverseSchema *)0x0))
  {
    local_60 = (SchemaAttDef *)0x0;
  }
  else {
    local_60 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                         ((BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)this_00,0);
  }
  if (local_50 != 0) {
    XVar13 = 0;
    do {
      if (&childAttGrpInfo->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef> ==
          (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
        pSVar8 = (SchemaAttDef *)0x0;
      }
      else {
        pSVar8 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                           (&childAttGrpInfo->fAttributes->
                             super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,XVar13);
      }
      pQVar5 = pSVar8->fAttName;
      baseName = pQVar5->fLocalPart;
      this_00 = (TraverseSchema *)baseAttGrpInfo;
      pSVar9 = XercesAttGroupInfo::getAttDef(baseAttGrpInfo,baseName,pQVar5->fURIId);
      if (pSVar9 == (SchemaAttDef *)0x0) {
        iVar15 = 0x71;
        if ((local_60 == (SchemaAttDef *)0x0) ||
           (this_00 = this, bVar7 = wildcardAllowsNamespace(this,local_60,pQVar5->fURIId), !bVar7))
        goto LAB_00336233;
      }
      else {
        DVar3 = (pSVar9->super_XMLAttDef).fDefaultType;
        DVar4 = (pSVar8->super_XMLAttDef).fDefaultType;
        if ((DVar3 == DefAttTypes_Max) && (DVar4 != DefAttTypes_Max)) {
          this_00 = this;
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x74,baseName,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        if (((DVar3 & Required) != DefAttTypes_Min) && ((DVar4 & Required) == DefAttTypes_Min)) {
          this_00 = this;
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x6e,baseName,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        if (DVar4 != DefAttTypes_Max) {
          this_00 = (TraverseSchema *)pSVar9->fDatatypeValidator;
          if ((this_00 == (TraverseSchema *)0x0) ||
             (cVar6 = (**(code **)(*(long *)this_00 + 0x48))(), cVar6 == '\0')) {
            this_00 = this;
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x6f,baseName,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          if ((DVar3 & Fixed) != DefAttTypes_Min) {
            iVar15 = 0x70;
            if ((DVar4 & Fixed) != DefAttTypes_Min) {
              pXVar11 = (pSVar9->super_XMLAttDef).fValue;
              pXVar10 = (pSVar8->super_XMLAttDef).fValue;
              if (pXVar11 == pXVar10) goto LAB_00336259;
              if ((pXVar11 != (XMLCh *)0x0) && (pXVar10 != (XMLCh *)0x0)) {
                do {
                  XVar1 = *pXVar11;
                  if (XVar1 == L'\0') goto LAB_00336288;
                  pXVar11 = pXVar11 + 1;
                  XVar2 = *pXVar10;
                  pXVar10 = pXVar10 + 1;
                } while (XVar1 == XVar2);
                goto LAB_00336233;
              }
              if (pXVar11 == (XMLCh *)0x0) {
                if (pXVar10 == (XMLCh *)0x0) goto LAB_00336259;
LAB_00336288:
                bVar7 = *pXVar10 == L'\0';
              }
              else {
                bVar7 = *pXVar11 == L'\0';
                if ((pXVar10 != (XMLCh *)0x0) && (*pXVar11 == L'\0')) goto LAB_00336288;
              }
              if (bVar7) goto LAB_00336259;
            }
LAB_00336233:
            this_00 = this;
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar15,baseName,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
      }
LAB_00336259:
      XVar13 = XVar13 + 1;
    } while (XVar13 != local_50);
  }
  if ((XVar14 == 0) ||
     (this_00 = (TraverseSchema *)childAttGrpInfo->fAnyAttributes, this_00 == (TraverseSchema *)0x0)
     ) {
    pSVar8 = (SchemaAttDef *)0x0;
  }
  else {
    pSVar8 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                       ((BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)this_00,0);
  }
  if (pSVar8 != (SchemaAttDef *)0x0) {
    if (local_60 == (SchemaAttDef *)0x0) {
      iVar15 = 0x72;
    }
    else {
      bVar7 = isWildCardSubset(this_00,local_60,pSVar8);
      iVar15 = 0x73;
      if ((bVar7) &&
         (iVar15 = 0x75,
         (local_60->super_XMLAttDef).fDefaultType <= (pSVar8->super_XMLAttDef).fDefaultType)) {
        return;
      }
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar15);
    return;
  }
  return;
}

Assistant:

void TraverseSchema::checkAttDerivationOK(const DOMElement* const elem,
                                          const XercesAttGroupInfo* const baseAttGrpInfo,
                                          const XercesAttGroupInfo* const childAttGrpInfo) {

    XMLSize_t baseAttCount = baseAttGrpInfo->attributeCount();
    XMLSize_t baseAnyAttCount = baseAttGrpInfo->anyAttributeCount();
    XMLSize_t childAttCount = childAttGrpInfo->attributeCount();
    XMLSize_t childAnyAttCount = childAttGrpInfo->anyAttributeCount();

    if ((childAttCount || childAnyAttCount) && (!baseAttCount && !baseAnyAttCount)) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_1);
    }

    const SchemaAttDef* baseAttWildCard = (baseAnyAttCount) ? baseAttGrpInfo->anyAttributeAt(0) : 0;

    for (XMLSize_t i=0; i<childAttCount; i++) {

        const SchemaAttDef* childAttDef = childAttGrpInfo->attributeAt(i);
        QName* childAttName = childAttDef->getAttName();
        const XMLCh* childLocalPart = childAttName->getLocalPart();
        const SchemaAttDef* baseAttDef = baseAttGrpInfo->getAttDef(childLocalPart, childAttName->getURI());

        if (baseAttDef) {

            XMLAttDef::DefAttTypes baseAttDefType = baseAttDef->getDefaultType();
            XMLAttDef::DefAttTypes childAttDefType = childAttDef->getDefaultType();

            // Constraint 2.1.1 & 3 + check for prohibited base attribute
            if (baseAttDefType == XMLAttDef::Prohibited
                && childAttDefType != XMLAttDef::Prohibited) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_8, childLocalPart);
            }

            if ((baseAttDefType & XMLAttDef::Required)
                && !(childAttDefType & XMLAttDef::Required)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_2, childLocalPart);
            }

            // if the attribute in the derived type is prohibited, and it didn't try to override a required attribute,
            // it's ok and shouldn't be tested for data type or fixed value
            if (childAttDefType == XMLAttDef::Prohibited)
                continue;

            // Constraint 2.1.2
            DatatypeValidator* baseDV = baseAttDef->getDatatypeValidator();
            DatatypeValidator* childDV = childAttDef->getDatatypeValidator();
            if (!baseDV || !baseDV->isSubstitutableBy(childDV)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_3, childLocalPart);
            }

            // Constraint 2.1.3
            if ((baseAttDefType & XMLAttDef::Fixed) &&
                (!(childAttDefType & XMLAttDef::Fixed) ||
                 !XMLString::equals(baseAttDef->getValue(), childAttDef->getValue()))) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_4, childLocalPart);
            }
        }
        // Constraint 2.2
        else if (!baseAttWildCard ||
                 !wildcardAllowsNamespace(baseAttWildCard, childAttName->getURI())) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_5, childLocalPart);
        }
    }

    // Constraint 4
    const SchemaAttDef* childAttWildCard = (childAnyAttCount) ? childAttGrpInfo->anyAttributeAt(0) : 0;

    if (childAttWildCard) {

        if (!baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_6);
        }
        else if (!isWildCardSubset(baseAttWildCard, childAttWildCard)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_7);
        }
        else if (childAttWildCard->getDefaultType() < baseAttWildCard->getDefaultType()) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_9);
        }
    }
}